

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::parseVersion(QPDFWriter *this,string *version,int *major,int *minor)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong *puVar9;
  uint uVar10;
  string tmp;
  string __str_1;
  string __str;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  iVar4 = QUtil::string_to_int((version->_M_dataplus)._M_p);
  *major = iVar4;
  *minor = 0;
  uVar5 = std::__cxx11::string::find((char)version,0x2e);
  if ((uVar5 != 0xffffffffffffffff) && (uVar5 < version->_M_string_length)) {
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)version);
    iVar4 = QUtil::string_to_int((char *)local_b0);
    *minor = iVar4;
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
  }
  uVar1 = *major;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar10 = 1;
  if (9 < uVar2) {
    uVar5 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar10 = uVar3;
      uVar8 = (uint)uVar5;
      if (uVar8 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_001e3f5f;
      }
      if (uVar8 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_001e3f5f;
      }
      if (uVar8 < 10000) goto LAB_001e3f5f;
      uVar5 = uVar5 / 10000;
      uVar3 = uVar10 + 4;
    } while (99999 < uVar8);
    uVar10 = uVar10 + 1;
  }
LAB_001e3f5f:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar10 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50[0] + (ulong)(uVar1 >> 0x1f)),uVar10,uVar2);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_80 = *puVar9;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar9;
    local_90 = (ulong *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar1 = *minor;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar10 = 1;
  if (9 < uVar2) {
    uVar5 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar10 = uVar3;
      uVar8 = (uint)uVar5;
      if (uVar8 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_001e4047;
      }
      if (uVar8 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_001e4047;
      }
      if (uVar8 < 10000) goto LAB_001e4047;
      uVar5 = uVar5 / 10000;
      uVar3 = uVar10 + 4;
    } while (99999 < uVar8);
    uVar10 = uVar10 + 1;
  }
LAB_001e4047:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar10 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_70),uVar10,uVar2);
  uVar5 = 0xf;
  if (local_90 != &local_80) {
    uVar5 = local_80;
  }
  if (uVar5 < (ulong)(local_68 + local_88)) {
    uVar5 = 0xf;
    if (local_70 != local_60) {
      uVar5 = local_60[0];
    }
    if ((ulong)(local_68 + local_88) <= uVar5) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
      goto LAB_001e40d2;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_001e40d2:
  local_b0 = &local_a0;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_a0 = *plVar6;
    uStack_98 = puVar7[3];
  }
  else {
    local_a0 = *plVar6;
    local_b0 = (long *)*puVar7;
  }
  local_a8 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::parseVersion(std::string const& version, int& major, int& minor) const
{
    major = QUtil::string_to_int(version.c_str());
    minor = 0;
    size_t p = version.find('.');
    if ((p != std::string::npos) && (version.length() > p)) {
        minor = QUtil::string_to_int(version.substr(p + 1).c_str());
    }
    std::string tmp = std::to_string(major) + "." + std::to_string(minor);
    if (tmp != version) {
        // The version number in the input is probably invalid. This happens with some files that
        // are designed to exercise bugs, such as files in the fuzzer corpus. Unfortunately
        // QPDFWriter doesn't have a way to give a warning, so we just ignore this case.
    }
}